

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O3

void rhash_sha256_init(sha256_ctx *ctx)

{
  ctx->length = 0;
  ctx->digest_length = 0x20;
  ctx->hash[0] = 0x6a09e667;
  ctx->hash[1] = 0xbb67ae85;
  ctx->hash[2] = 0x3c6ef372;
  ctx->hash[3] = 0xa54ff53a;
  ctx->hash[4] = 0x510e527f;
  ctx->hash[5] = 0x9b05688c;
  ctx->hash[6] = 0x1f83d9ab;
  ctx->hash[7] = 0x5be0cd19;
  return;
}

Assistant:

void rhash_sha256_init(sha256_ctx* ctx)
{
	/* Initial values. These words were obtained by taking the first 32
	 * bits of the fractional parts of the square roots of the first
	 * eight prime numbers. */
	static const unsigned SHA256_H0[8] = {
		0x6a09e667, 0xbb67ae85, 0x3c6ef372, 0xa54ff53a,
		0x510e527f, 0x9b05688c, 0x1f83d9ab, 0x5be0cd19
	};

	ctx->length = 0;
	ctx->digest_length = sha256_hash_size;

	/* initialize algorithm state */
	memcpy(ctx->hash, SHA256_H0, sizeof(ctx->hash));
}